

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caniter.cpp
# Opt level: O0

Hashtable * __thiscall
icu_63::CanonicalIterator::extract
          (CanonicalIterator *this,Hashtable *fillinResult,UChar32 comp,UChar *segment,
          int32_t segLen,int32_t segmentPos,UErrorCode *status)

{
  UBool UVar1;
  int8_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  UnicodeString *this_00;
  char16_t *pcVar5;
  int iVar6;
  ConstChar16Ptr *srcChars;
  bool bVar7;
  UnicodeString *local_1f8;
  ConstChar16Ptr local_1a8;
  undefined1 local_1a0 [8];
  UnicodeString trial;
  UnicodeString local_150;
  char16_t local_10a;
  uint16_t __c2_2;
  UChar local_fe;
  int local_fc;
  uint16_t __c2_1;
  int32_t i;
  int iStack_f0;
  uint16_t __c2;
  UChar32 decompCp;
  int32_t decompPos;
  UChar32 cp;
  UBool ok;
  char16_t *pcStack_e0;
  int32_t decompLen;
  UChar *decomp;
  undefined1 local_d0 [8];
  UnicodeString decompString;
  undefined1 local_78 [4];
  int32_t inputLen;
  UnicodeString temp;
  int32_t segmentPos_local;
  int32_t segLen_local;
  UChar *segment_local;
  UChar32 comp_local;
  Hashtable *fillinResult_local;
  CanonicalIterator *this_local;
  
  temp.fUnion._48_4_ = segmentPos;
  temp.fUnion._52_4_ = segLen;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    UnicodeString::UnicodeString((UnicodeString *)local_78,comp);
    iVar3 = UnicodeString::length((UnicodeString *)local_78);
    UnicodeString::UnicodeString((UnicodeString *)local_d0);
    srcChars = (ConstChar16Ptr *)local_78;
    (*(this->nfd->super_UObject)._vptr_UObject[3])(this->nfd,srcChars,local_d0,status);
    UVar1 = ::U_FAILURE(*status);
    if (UVar1 == '\0') {
      UVar1 = UnicodeString::isBogus((UnicodeString *)local_d0);
      if (UVar1 == '\0') {
        pcStack_e0 = UnicodeString::getBuffer((UnicodeString *)local_d0);
        cp = UnicodeString::length((UnicodeString *)local_d0);
        decompPos._3_1_ = '\0';
        iStack_f0 = 1;
        i = (int32_t)(ushort)*pcStack_e0;
        iVar6 = 1;
        if ((((i & 0xfffffc00U) == 0xd800) && (cp != 1)) &&
           (__c2_1 = pcStack_e0[1], iVar6 = iStack_f0, (__c2_1 & 0xfc00) == 0xdc00)) {
          i = i * 0x400 + (uint)__c2_1 + -0x35fdc00;
          iVar6 = 2;
        }
        iStack_f0 = iVar6;
        local_fc = temp.fUnion._48_4_;
        iVar6 = iStack_f0;
        while (iStack_f0 = iVar6, local_fc < (int)temp.fUnion._52_4_) {
          iVar6 = local_fc + 1;
          decompCp = (UChar32)(ushort)segment[local_fc];
          if ((((decompCp & 0xfffffc00U) == 0xd800) && (iVar6 != temp.fUnion._52_4_)) &&
             (local_fe = segment[iVar6], (local_fe & 0xfc00U) == 0xdc00)) {
            decompCp = decompCp * 0x400 + (uint)(ushort)local_fe + -0x35fdc00;
            iVar6 = local_fc + 2;
          }
          local_fc = iVar6;
          if (decompCp == i) {
            if (iStack_f0 == cp) {
              ConstChar16Ptr::ConstChar16Ptr
                        ((ConstChar16Ptr *)&stack0xfffffffffffffef8,segment + local_fc);
              srcChars = (ConstChar16Ptr *)&stack0xfffffffffffffef8;
              UnicodeString::append
                        ((UnicodeString *)local_78,srcChars,temp.fUnion._52_4_ - local_fc);
              ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&stack0xfffffffffffffef8);
              decompPos._3_1_ = '\x01';
              break;
            }
            iVar6 = iStack_f0 + 1;
            i = (int32_t)(ushort)pcStack_e0[iStack_f0];
            if ((((i & 0xfffffc00U) == 0xd800) && (iVar6 != cp)) &&
               (local_10a = pcStack_e0[iVar6], (local_10a & 0xfc00U) == 0xdc00)) {
              i = i * 0x400 + (uint)(ushort)local_10a + -0x35fdc00;
              iVar6 = iStack_f0 + 2;
            }
          }
          else {
            srcChars = (ConstChar16Ptr *)(ulong)(uint)decompCp;
            UnicodeString::append((UnicodeString *)local_78,decompCp);
            iVar6 = iStack_f0;
          }
        }
        if (decompPos._3_1_ == '\0') {
          this_local = (CanonicalIterator *)0x0;
          decomp._4_4_ = 1;
        }
        else {
          iVar4 = UnicodeString::length((UnicodeString *)local_78);
          if (iVar3 == iVar4) {
            UnicodeString::UnicodeString(&local_150);
            this_00 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)srcChars);
            trial.fUnion.fStackFields.fBuffer[0x1a]._1_1_ = 0;
            local_1f8 = (UnicodeString *)0x0;
            if (this_00 != (UnicodeString *)0x0) {
              trial.fUnion.fStackFields.fBuffer[0x1a]._1_1_ = 1;
              UnicodeString::UnicodeString(this_00);
              local_1f8 = this_00;
            }
            Hashtable::put(fillinResult,&local_150,local_1f8,status);
            UnicodeString::~UnicodeString(&local_150);
            decomp._4_4_ = 1;
            this_local = (CanonicalIterator *)fillinResult;
          }
          else {
            UnicodeString::UnicodeString((UnicodeString *)local_1a0);
            (*(this->nfd->super_UObject)._vptr_UObject[3])(this->nfd,local_78,local_1a0,status);
            UVar1 = ::U_FAILURE(*status);
            bVar7 = true;
            if (UVar1 == '\0') {
              ConstChar16Ptr::ConstChar16Ptr(&local_1a8,segment + (int)temp.fUnion._48_4_);
              iVar2 = UnicodeString::compare
                                ((UnicodeString *)local_1a0,&local_1a8,
                                 temp.fUnion._52_4_ - temp.fUnion._48_4_);
              bVar7 = iVar2 != '\0';
              ConstChar16Ptr::~ConstChar16Ptr(&local_1a8);
            }
            if (bVar7) {
              this_local = (CanonicalIterator *)0x0;
            }
            else {
              pcVar5 = UnicodeString::getBuffer((UnicodeString *)local_78);
              iVar4 = UnicodeString::length((UnicodeString *)local_78);
              this_local = (CanonicalIterator *)
                           getEquivalents2(this,fillinResult,pcVar5 + iVar3,iVar4 - iVar3,status);
            }
            decomp._4_4_ = 1;
            UnicodeString::~UnicodeString((UnicodeString *)local_1a0);
          }
        }
      }
      else {
        *status = U_MEMORY_ALLOCATION_ERROR;
        this_local = (CanonicalIterator *)0x0;
        decomp._4_4_ = 1;
      }
    }
    else {
      this_local = (CanonicalIterator *)0x0;
      decomp._4_4_ = 1;
    }
    UnicodeString::~UnicodeString((UnicodeString *)local_d0);
    UnicodeString::~UnicodeString((UnicodeString *)local_78);
  }
  else {
    this_local = (CanonicalIterator *)0x0;
  }
  return (Hashtable *)this_local;
}

Assistant:

Hashtable *CanonicalIterator::extract(Hashtable *fillinResult, UChar32 comp, const UChar *segment, int32_t segLen, int32_t segmentPos, UErrorCode &status) {
//Hashtable *CanonicalIterator::extract(UChar32 comp, const UnicodeString &segment, int32_t segLen, int32_t segmentPos, UErrorCode &status) {
    //if (PROGRESS) printf(" extract: %s, ", UToS(Tr(UnicodeString(comp))));
    //if (PROGRESS) printf("%s, %i\n", UToS(Tr(segment)), segmentPos);

    if (U_FAILURE(status)) {
        return NULL;
    }

    UnicodeString temp(comp);
    int32_t inputLen=temp.length();
    UnicodeString decompString;
    nfd.normalize(temp, decompString, status);
    if (U_FAILURE(status)) {
        return NULL;
    }
    if (decompString.isBogus()) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return NULL;
    }
    const UChar *decomp=decompString.getBuffer();
    int32_t decompLen=decompString.length();

    // See if it matches the start of segment (at segmentPos)
    UBool ok = FALSE;
    UChar32 cp;
    int32_t decompPos = 0;
    UChar32 decompCp;
    U16_NEXT(decomp, decompPos, decompLen, decompCp);

    int32_t i = segmentPos;
    while(i < segLen) {
        U16_NEXT(segment, i, segLen, cp);

        if (cp == decompCp) { // if equal, eat another cp from decomp

            //if (PROGRESS) printf("  matches: %s\n", UToS(Tr(UnicodeString(cp))));

            if (decompPos == decompLen) { // done, have all decomp characters!
                temp.append(segment+i, segLen-i);
                ok = TRUE;
                break;
            }
            U16_NEXT(decomp, decompPos, decompLen, decompCp);
        } else {
            //if (PROGRESS) printf("  buffer: %s\n", UToS(Tr(UnicodeString(cp))));

            // brute force approach
            temp.append(cp);

            /* TODO: optimize
            // since we know that the classes are monotonically increasing, after zero
            // e.g. 0 5 7 9 0 3
            // we can do an optimization
            // there are only a few cases that work: zero, less, same, greater
            // if both classes are the same, we fail
            // if the decomp class < the segment class, we fail

            segClass = getClass(cp);
            if (decompClass <= segClass) return null;
            */
        }
    }
    if (!ok)
        return NULL; // we failed, characters left over

    //if (PROGRESS) printf("Matches\n");

    if (inputLen == temp.length()) {
        fillinResult->put(UnicodeString(), new UnicodeString(), status);
        return fillinResult; // succeed, but no remainder
    }

    // brute force approach
    // check to make sure result is canonically equivalent
    UnicodeString trial;
    nfd.normalize(temp, trial, status);
    if(U_FAILURE(status) || trial.compare(segment+segmentPos, segLen - segmentPos) != 0) {
        return NULL;
    }

    return getEquivalents2(fillinResult, temp.getBuffer()+inputLen, temp.length()-inputLen, status);
}